

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

void Dar_BalancePushUniqueOrderByLevel(Vec_Ptr_t *vStore,Aig_Obj_t *pObj,int fExor)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  void **ppvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  uVar4 = vStore->nSize;
  if (0 < (long)(int)uVar4) {
    lVar8 = 0;
    do {
      if ((Aig_Obj_t *)vStore->pArray[lVar8] == pObj) {
        if (fExor == 0) {
          return;
        }
        uVar4 = vStore->nSize;
        lVar8 = (ulong)uVar4 + 1;
        do {
          if ((int)lVar8 + -1 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar6 = lVar8 + -1;
          lVar3 = lVar8 + -2;
          lVar8 = lVar6;
        } while ((Aig_Obj_t *)vStore->pArray[lVar3] != pObj);
        for (; (int)lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
          vStore->pArray[lVar6 + -1] = vStore->pArray[lVar6];
        }
        vStore->nSize = uVar4 - 1;
        return;
      }
      lVar8 = lVar8 + 1;
    } while ((int)uVar4 != lVar8);
  }
  uVar1 = vStore->nCap;
  if (uVar4 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStore->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vStore->pArray,0x80);
      }
      vStore->pArray = ppvVar5;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_0048806f;
      if (vStore->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vStore->pArray,(ulong)uVar1 << 4);
      }
      vStore->pArray = ppvVar5;
    }
    vStore->nCap = iVar9;
  }
LAB_0048806f:
  uVar7 = (ulong)vStore->nSize;
  uVar4 = vStore->nSize + 1;
  vStore->nSize = uVar4;
  vStore->pArray[uVar7] = pObj;
  if (0 < (long)uVar7) {
    lVar8 = (ulong)uVar4 - 2;
    do {
      ppvVar5 = vStore->pArray;
      pvVar2 = ppvVar5[uVar7 & 0xffffffff];
      if ((*(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x1c) & 0xffffff) <=
          (*(uint *)(((ulong)ppvVar5[lVar8] & 0xfffffffffffffffe) + 0x1c) & 0xffffff)) {
        return;
      }
      ppvVar5[uVar7 & 0xffffffff] = ppvVar5[lVar8];
      vStore->pArray[lVar8] = pvVar2;
      iVar9 = (int)uVar7;
      uVar7 = (ulong)(iVar9 - 1);
      lVar8 = lVar8 + -1;
    } while (1 < iVar9);
  }
  return;
}

Assistant:

void Dar_BalancePushUniqueOrderByLevel( Vec_Ptr_t * vStore, Aig_Obj_t * pObj, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i;
    if ( Vec_PtrPushUnique(vStore, pObj) )
    {
        if ( fExor )
            Vec_PtrRemove(vStore, pObj);
        return;
    }
    // find the p of the node
    for ( i = vStore->nSize-1; i > 0; i-- )
    {
        pObj1 = (Aig_Obj_t *)vStore->pArray[i  ];
        pObj2 = (Aig_Obj_t *)vStore->pArray[i-1];
        if ( Aig_ObjLevel(Aig_Regular(pObj1)) <= Aig_ObjLevel(Aig_Regular(pObj2)) )
            break;
        vStore->pArray[i  ] = pObj2;
        vStore->pArray[i-1] = pObj1;
    }
}